

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O0

vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> * __thiscall
libDAI::JTree::beliefs(JTree *this)

{
  size_t sVar1;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *this_00;
  value_type *pvVar2;
  long *in_RSI;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_RDI;
  size_t alpha;
  size_t beta;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *result;
  value_type *in_stack_ffffffffffffff88;
  value_type *__x;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_ffffffffffffff90;
  value_type *local_38;
  size_type local_20;
  
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb63a25)
  ;
  local_20 = 0;
  while( true ) {
    (**(code **)(*in_RSI + 0x20))();
    sVar1 = RegionGraph::nr_IRs((RegionGraph *)0xb63a57);
    if (sVar1 <= local_20) break;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RSI + 0x45),local_20);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_20 = local_20 + 1;
  }
  local_38 = (value_type *)0x0;
  while( true ) {
    __x = local_38;
    this_00 = (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
              (**(code **)(*in_RSI + 0x20))();
    pvVar2 = (value_type *)RegionGraph::nr_ORs((RegionGraph *)0xb63af3);
    if (pvVar2 <= __x) break;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RSI + 0x42),(size_type)local_38);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              (this_00,__x);
    local_38 = (value_type *)
               ((long)&(local_38->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  return in_RDI;
}

Assistant:

vector<Factor> JTree::beliefs() const {
        vector<Factor> result;
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            result.push_back( _Qb[beta] );
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            result.push_back( _Qa[alpha] );
        return result;
    }